

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_resolver.cpp
# Opt level: O0

void __thiscall
cpptrace::detail::libdwarf::dwarf_resolver::get_inlines_info
          (dwarf_resolver *this,die_object *cu_die,die_object *die,Dwarf_Addr pc,
          Dwarf_Half dwversion,
          vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *inlines)

{
  source_location location;
  bool bVar1;
  Dwarf_Half DVar2;
  reference_wrapper<const_cpptrace::detail::libdwarf::die_object> *this_00;
  char *in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  optional<std::reference_wrapper<const_cpptrace::detail::libdwarf::die_object>,_0> *this_01;
  bool local_f9;
  anon_class_56_7_2a510682 local_f8;
  function<bool_(const_cpptrace::detail::libdwarf::die_object_&)> local_c0;
  undefined1 local_a0 [8];
  optional<std::reference_wrapper<const_cpptrace::detail::libdwarf::die_object>,_0> target_die;
  undefined1 local_88 [8];
  die_object child;
  undefined1 local_68 [8];
  optional<std::reference_wrapper<const_cpptrace::detail::libdwarf::die_object>,_0> current_die;
  die_object current_obj_holder;
  vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *inlines_local;
  Dwarf_Half dwversion_local;
  Dwarf_Addr pc_local;
  die_object *die_local;
  die_object *cu_die_local;
  dwarf_resolver *this_local;
  
  DVar2 = die_object::get_tag(die);
  local_f9 = true;
  if (DVar2 != 0x2e) {
    DVar2 = die_object::get_tag(die);
    local_f9 = DVar2 == 0x1d;
  }
  source_location::source_location
            ((source_location *)&current_obj_holder.die,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
             ,0x178);
  location._8_8_ = in_stack_fffffffffffffee0;
  location.file = in_stack_fffffffffffffed8;
  assert_impl<bool>((detail *)(ulong)local_f9,false,0x33f124,
                    "void cpptrace::detail::libdwarf::dwarf_resolver::get_inlines_info(const die_object &, const die_object &, Dwarf_Addr, Dwarf_Half, std::vector<stacktrace_frame> &)"
                    ,(char *)current_obj_holder.die,location);
  die_object::die_object((die_object *)&current_die.holds_value,this->dbg,(Dwarf_Die)0x0);
  optional<std::reference_wrapper<const_cpptrace::detail::libdwarf::die_object>,_0>::
  optional<const_cpptrace::detail::libdwarf::die_object_&,_0>
            ((optional<std::reference_wrapper<const_cpptrace::detail::libdwarf::die_object>,_0> *)
             local_68,die);
  do {
    bVar1 = optional<std::reference_wrapper<const_cpptrace::detail::libdwarf::die_object>,_0>::
            has_value((optional<std::reference_wrapper<const_cpptrace::detail::libdwarf::die_object>,_0>
                       *)local_68);
    if (!bVar1) break;
    this_00 = optional<std::reference_wrapper<const_cpptrace::detail::libdwarf::die_object>,_0>::
              unwrap((optional<std::reference_wrapper<const_cpptrace::detail::libdwarf::die_object>,_0>
                      *)local_68);
    std::reference_wrapper<const_cpptrace::detail::libdwarf::die_object>::get(this_00);
    die_object::get_child((die_object *)local_88);
    bVar1 = die_object::operator_cast_to_bool((die_object *)local_88);
    if (bVar1) {
      this_01 = (optional<std::reference_wrapper<const_cpptrace::detail::libdwarf::die_object>,_0> *
                )local_a0;
      optional<std::reference_wrapper<const_cpptrace::detail::libdwarf::die_object>,_0>::optional
                (this_01);
      local_f8.current_obj_holder = (die_object *)&current_die.holds_value;
      local_f8.this = this;
      local_f8.cu_die = cu_die;
      local_f8.pc = pc;
      local_f8.dwversion = dwversion;
      local_f8.inlines = inlines;
      local_f8.target_die = this_01;
      std::function<bool(cpptrace::detail::libdwarf::die_object_const&)>::
      function<cpptrace::detail::libdwarf::dwarf_resolver::get_inlines_info(cpptrace::detail::libdwarf::die_object_const&,cpptrace::detail::libdwarf::die_object_const&,unsigned_long_long,unsigned_short,std::vector<cpptrace::stacktrace_frame,std::allocator<cpptrace::stacktrace_frame>>&)::_lambda(cpptrace::detail::libdwarf::die_object_const&)_1_,void>
                ((function<bool(cpptrace::detail::libdwarf::die_object_const&)> *)&local_c0,
                 &local_f8);
      walk_die_list((die_object *)local_88,&local_c0);
      std::function<bool_(const_cpptrace::detail::libdwarf::die_object_&)>::~function(&local_c0);
      optional<std::reference_wrapper<const_cpptrace::detail::libdwarf::die_object>,_0>::operator=
                ((optional<std::reference_wrapper<const_cpptrace::detail::libdwarf::die_object>,_0>
                  *)local_68,
                 (optional<std::reference_wrapper<const_cpptrace::detail::libdwarf::die_object>,_0>
                  *)local_a0);
      optional<std::reference_wrapper<const_cpptrace::detail::libdwarf::die_object>,_0>::~optional
                ((optional<std::reference_wrapper<const_cpptrace::detail::libdwarf::die_object>,_0>
                  *)local_a0);
      target_die._12_4_ = 0;
    }
    else {
      target_die._12_4_ = 3;
    }
    die_object::~die_object((die_object *)local_88);
  } while (target_die._12_4_ == 0);
  optional<std::reference_wrapper<const_cpptrace::detail::libdwarf::die_object>,_0>::~optional
            ((optional<std::reference_wrapper<const_cpptrace::detail::libdwarf::die_object>,_0> *)
             local_68);
  die_object::~die_object((die_object *)&current_die.holds_value);
  return;
}

Assistant:

void get_inlines_info(
            const die_object& cu_die,
            const die_object& die,
            Dwarf_Addr pc,
            Dwarf_Half dwversion,
            std::vector<stacktrace_frame>& inlines
        ) {
            ASSERT(die.get_tag() == DW_TAG_subprogram || die.get_tag() == DW_TAG_inlined_subroutine);
            // get_inlines_info is recursive and recurses into dies with pc ranges matching the pc we're looking for,
            // however, because I wouldn't want anything stack overflowing I'm breaking the recursion out into a loop
            // while looping when we find the target die we need to be able to store a die somewhere that doesn't die
            // at the end of the list traversal, we'll use this as a holder for it
            die_object current_obj_holder(dbg, nullptr);
            optional<std::reference_wrapper<const die_object>> current_die = die;
            while(current_die.has_value()) {
                auto child = current_die.unwrap().get().get_child();
                if(!child) {
                    break;
                }
                optional<std::reference_wrapper<const die_object>> target_die;
                walk_die_list(
                    child,
                    [this, &cu_die, pc, dwversion, &inlines, &target_die, &current_obj_holder] (const die_object& die) {
                        if(die.get_tag() == DW_TAG_inlined_subroutine && die.pc_in_die(cu_die, dwversion, pc)) {
                            const auto name = subprogram_symbol(die, dwversion);
                            auto file_i = die.get_unsigned_attribute(DW_AT_call_file);
                            // TODO: Refactor.... Probably put logic in resolve_filename.
                            if(file_i) {
                                // for dwarf 2, 3, 4, and experimental line table version 0xfe06 1-indexing is used
                                // for dwarf 5 0-indexing is used
                                optional<std::reference_wrapper<line_table_info>> line_table_opt;
                                if(skeleton) {
                                    line_table_opt = skeleton.unwrap().resolver.get_line_table(
                                        skeleton.unwrap().cu_die
                                    );
                                } else {
                                    line_table_opt = get_line_table(cu_die);
                                }
                                if(line_table_opt) {
                                    auto& line_table = line_table_opt.unwrap().get();
                                    if(line_table.version != 5) {
                                        if(file_i.unwrap() == 0) {
                                            file_i.reset(); // 0 means no name to be found
                                        } else {
                                            // decrement to 0-based index
                                            file_i.unwrap()--;
                                        }
                                    }
                                } else {
                                    // silently continue
                                }
                            }
                            std::string file = file_i ? resolve_filename(cu_die, file_i.unwrap()) : "";
                            const auto line = die.get_unsigned_attribute(DW_AT_call_line);
                            const auto col = die.get_unsigned_attribute(DW_AT_call_column);
                            inlines.push_back(stacktrace_frame{
                                0,
                                0, // TODO: Could put an object address here...
                                {static_cast<std::uint32_t>(line.value_or(0))},
                                {static_cast<std::uint32_t>(col.value_or(0))},
                                file,
                                name,
                                true
                            });
                            current_obj_holder = die.clone();
                            target_die = current_obj_holder;
                            return false;
                        } else {
                            return true;
                        }
                    }
                );
                // recursing into the found target as-if by get_inlines_info(cu_die, die, pc, dwversion, inlines);
                current_die = target_die;
            }
        }